

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureblitter.cpp
# Opt level: O0

void __thiscall QOpenGLTextureBlitter::release(QOpenGLTextureBlitter *this)

{
  bool bVar1;
  ProgramIndex PVar2;
  QOpenGLTextureBlitterPrivate *pQVar3;
  Program *this_00;
  Program *p;
  QOpenGLTextureBlitterPrivate *d;
  GLenum in_stack_ffffffffffffffd8;
  Program *this_01;
  
  pQVar3 = d_func((QOpenGLTextureBlitter *)0x19dc97);
  this_01 = pQVar3->programs;
  PVar2 = targetToProgramIndex(in_stack_ffffffffffffffd8);
  this_00 = this_01 + PVar2;
  bVar1 = QScopedPointer::operator_cast_to_bool
                    ((QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>
                      *)0x19dcd9);
  if (bVar1) {
    QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::operator->
              (&this_00->glProgram);
    QOpenGLShaderProgram::release((QOpenGLShaderProgram *)this_01);
  }
  QScopedPointer<QOpenGLVertexArrayObject,_QScopedPointerDeleter<QOpenGLVertexArrayObject>_>::
  operator->(&pQVar3->vao);
  bVar1 = QOpenGLVertexArrayObject::isCreated((QOpenGLVertexArrayObject *)this_01);
  if (bVar1) {
    QScopedPointer<QOpenGLVertexArrayObject,_QScopedPointerDeleter<QOpenGLVertexArrayObject>_>::
    operator->(&pQVar3->vao);
    QOpenGLVertexArrayObject::release((QOpenGLVertexArrayObject *)this_01);
  }
  return;
}

Assistant:

void QOpenGLTextureBlitter::release()
{
    Q_D(QOpenGLTextureBlitter);
    QOpenGLTextureBlitterPrivate::Program *p = &d->programs[targetToProgramIndex(d->currentTarget)];
    if (p->glProgram)
        p->glProgram->release();
    if (d->vao->isCreated())
        d->vao->release();
}